

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Header.cpp
# Opt level: O2

void __thiscall KDIS::PDU::LE_Header::Decode(LE_Header *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0xf < iVar2 + (uint)KVar1) {
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_EntID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntID,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LE_Header::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LE_HEADER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EntID;
}